

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlglClose(void)

{
  rlRenderBatch in_stack_00000000;
  
  rlUnloadRenderBatch(in_stack_00000000);
  (*glad_glUseProgram)(0);
  (*glad_glDetachShader)(RLGL.State.defaultShaderId,RLGL.State.defaultVShaderId);
  (*glad_glDetachShader)(RLGL.State.defaultShaderId,RLGL.State.defaultFShaderId);
  (*glad_glDeleteShader)(RLGL.State.defaultVShaderId);
  (*glad_glDeleteShader)(RLGL.State.defaultFShaderId);
  (*glad_glDeleteProgram)(RLGL.State.defaultShaderId);
  free(RLGL.State.defaultShaderLocs);
  TraceLog(3,"SHADER: [ID %i] Default shader unloaded successfully",
           (ulong)RLGL.State.defaultShaderId);
  (*glad_glDeleteTextures)(1,(GLuint *)0x23a9f0);
  TraceLog(3,"TEXTURE: [ID %i] Default texture unloaded successfully",
           (ulong)RLGL.State.defaultTextureId);
  return;
}

Assistant:

void rlglClose(void)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    rlUnloadRenderBatch(RLGL.defaultBatch);

    rlUnloadShaderDefault();          // Unload default shader

    glDeleteTextures(1, &RLGL.State.defaultTextureId); // Unload default texture
    TRACELOG(RL_LOG_INFO, "TEXTURE: [ID %i] Default texture unloaded successfully", RLGL.State.defaultTextureId);
#endif
}